

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileBlockManager::SingleFileBlockManager
          (SingleFileBlockManager *this,AttachedDatabase *db,string *path_p,
          StorageManagerOptions *options)

{
  _Rb_tree_header *p_Var1;
  idx_t iVar2;
  bool bVar3;
  undefined7 uVar4;
  bool bVar5;
  bool bVar6;
  DebugInitialize DVar7;
  undefined5 uVar8;
  BufferManager *buffer_manager;
  Allocator *allocator;
  idx_t iVar9;
  idx_t iVar10;
  
  buffer_manager = BufferManager::GetBufferManager(db);
  BlockManager::BlockManager
            (&this->super_BlockManager,buffer_manager,
             (optional_idx)(options->block_alloc_size).index,
             (optional_idx)(options->block_header_size).index);
  (this->super_BlockManager)._vptr_BlockManager =
       (_func_int **)&PTR__SingleFileBlockManager_027a0540;
  this->db = db;
  ::std::__cxx11::string::string((string *)&this->path,(string *)path_p);
  (this->handle).super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t
  .super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = (FileHandle *)0x0;
  allocator = Allocator::Get(db);
  iVar9 = optional_idx::GetIndex(&options->block_header_size);
  iVar10 = optional_idx::GetIndex(&options->block_header_size);
  FileBuffer::FileBuffer(&this->header_buffer,allocator,MANAGED_BUFFER,0x1000 - iVar9,iVar10);
  p_Var1 = &(this->free_list)._M_t._M_impl.super__Rb_tree_header;
  (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->newly_freed_list)._M_t._M_impl.super__Rb_tree_header;
  (this->newly_freed_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->newly_freed_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->newly_freed_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->newly_freed_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->newly_freed_list)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->multi_use_blocks)._M_h._M_buckets = &(this->multi_use_blocks)._M_h._M_single_bucket;
  (this->multi_use_blocks)._M_h._M_bucket_count = 1;
  (this->multi_use_blocks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->multi_use_blocks)._M_h._M_element_count = 0;
  (this->multi_use_blocks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->multi_use_blocks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->multi_use_blocks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->modified_blocks)._M_h._M_buckets = &(this->modified_blocks)._M_h._M_single_bucket;
  (this->modified_blocks)._M_h._M_bucket_count = 1;
  (this->modified_blocks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->modified_blocks)._M_h._M_element_count = 0;
  (this->modified_blocks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->modified_blocks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->modified_blocks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->iteration_count = 0;
  bVar5 = options->read_only;
  bVar6 = options->use_direct_io;
  DVar7 = options->debug_initialize;
  uVar8 = *(undefined5 *)&options->field_0x3;
  iVar9 = (options->block_alloc_size).index;
  iVar10 = (options->storage_version).index;
  iVar2 = (options->version_number).index;
  bVar3 = options->encryption;
  uVar4 = *(undefined7 *)&options->field_0x29;
  (this->options).block_header_size.index = (options->block_header_size).index;
  (this->options).encryption = bVar3;
  *(undefined7 *)&(this->options).field_0x29 = uVar4;
  (this->options).storage_version.index = iVar10;
  (this->options).version_number.index = iVar2;
  (this->options).read_only = bVar5;
  (this->options).use_direct_io = bVar6;
  (this->options).debug_initialize = DVar7;
  *(undefined5 *)&(this->options).field_0x3 = uVar8;
  (this->options).block_alloc_size.index = iVar9;
  *(undefined8 *)((long)&(this->block_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->block_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->block_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->block_lock).super___mutex_base._M_mutex + 8) = 0;
  (this->block_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  return;
}

Assistant:

SingleFileBlockManager::SingleFileBlockManager(AttachedDatabase &db, const string &path_p,
                                               const StorageManagerOptions &options)
    : BlockManager(BufferManager::GetBufferManager(db), options.block_alloc_size, options.block_header_size), db(db),
      path(path_p), header_buffer(Allocator::Get(db), FileBufferType::MANAGED_BUFFER,
                                  Storage::FILE_HEADER_SIZE - options.block_header_size.GetIndex(),
                                  options.block_header_size.GetIndex()),
      iteration_count(0), options(options) {
}